

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

void google::protobuf::internal::
     arena_destruct_object<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
               (void *object)

{
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  ::Container::~Container((Container *)0x1cbe9e);
  return;
}

Assistant:

void arena_destruct_object(void* object) {
  reinterpret_cast<T*>(object)->~T();
}